

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi_info_from_file(FILE *f,int *x,int *y,int *comp)

{
  stbi_uc *data;
  int iVar1;
  long __off;
  stbi__context s;
  stbi__context local_100;
  
  __off = ftell((FILE *)f);
  data = local_100.buffer_start;
  local_100.io.read._0_4_ = 0x105fa7;
  local_100.io.read._4_4_ = 0;
  local_100.io.skip._0_4_ = 0x105fbd;
  local_100.io.skip._4_4_ = 0;
  local_100.io.eof = stbi__stdio_eof;
  local_100.read_from_callbacks = 1;
  local_100.buflen = 0x80;
  local_100.io_user_data = f;
  local_100.img_buffer_original = data;
  iVar1 = stbi__stdio_read(f,(char *)data,0x80);
  if (iVar1 == 0) {
    local_100.img_buffer_end = local_100.buffer_start + 1;
    local_100._48_8_ = local_100._48_8_ & 0xffffffff00000000;
    local_100.buffer_start[0] = '\0';
  }
  else {
    local_100.img_buffer_end = data + iVar1;
  }
  local_100.img_buffer = data;
  iVar1 = stbi__info_main(&local_100,x,y,comp);
  fseek((FILE *)f,__off,0);
  return iVar1;
}

Assistant:

STBIDEF int stbi_info_from_file(FILE *f, int *x, int *y, int *comp)
{
   int r;
   stbi__context s;
   long pos = ftell(f);
   stbi__start_file(&s, f);
   r = stbi__info_main(&s,x,y,comp);
   fseek(f,pos,SEEK_SET);
   return r;
}